

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O1

void __thiscall CNet::Refine(CNet *this)

{
  byte bVar1;
  pointer ppCVar2;
  CWire *pCVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  pointer ppCVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  CNet *this_00;
  ulong uVar12;
  bool bVar13;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  RedPoint;
  allocator_type local_89;
  value_type local_88;
  CNet *local_78;
  _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
  local_70;
  pointer local_60;
  hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
  local_58;
  
  if (((this->super_CObject).m_iProp & 1) == 0) {
    ppCVar8 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar2 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar13 = ppCVar8 == ppCVar2;
    if (!bVar13) {
      bVar1 = (byte)((*ppCVar8)->super_CObject).m_iState;
      while ((bVar1 & 1) != 0) {
        ppCVar8 = ppCVar8 + 1;
        bVar13 = ppCVar8 == ppCVar2;
        if (bVar13) break;
        bVar1 = (byte)((*ppCVar8)->super_CObject).m_iState;
      }
    }
    if (bVar13) {
      SplitWire(this);
      __gnu_cxx::
      hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
      ::hashtable(&local_58,100,(hash<long_long> *)&local_88,(equal_to<long_long> *)&local_70,
                  &local_89);
      ppCVar8 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar2 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_78 = this;
      if (ppCVar8 != ppCVar2) {
        do {
          pCVar3 = *ppCVar8;
          local_88.first = (longlong)((uint)(pCVar3->m_pPointS->super_CObject).m_Key & 0xffffff00);
          local_88.second = 0;
          pvVar7 = __gnu_cxx::
                   hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                   ::find_or_insert(&local_58,&local_88);
          pvVar7->second = pvVar7->second + 1;
          local_88.first = (longlong)((uint)(pCVar3->m_pPointE->super_CObject).m_Key & 0xffffff00);
          local_88.second = 0;
          pvVar7 = __gnu_cxx::
                   hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                   ::find_or_insert(&local_58,&local_88);
          pvVar7->second = pvVar7->second + 1;
          ppCVar8 = ppCVar8 + 1;
        } while (ppCVar8 != ppCVar2);
      }
      this_00 = local_78;
      if (0 < local_78->m_iNumPin) {
        lVar9 = 0;
        do {
          local_88.first =
               (longlong)
               ((uint)(this_00->m_ppPin[lVar9]->super_CPoint).super_CObject.m_Key & 0xffffff00);
          __gnu_cxx::
          hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
          ::erase(&local_58,&local_88.first);
          lVar9 = lVar9 + 1;
        } while (lVar9 < this_00->m_iNumPin);
      }
      if ((long)local_58._M_buckets.
                super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58._M_buckets.
                super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar9 = (long)local_58._M_buckets.
                      super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58._M_buckets.
                      super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        lVar10 = 0;
        do {
          local_70._M_cur =
               local_58._M_buckets.
               super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar10];
          if (local_70._M_cur != (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0)
          goto LAB_001196d4;
          lVar10 = lVar10 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
      }
      local_70._M_cur = (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0;
LAB_001196d4:
      local_70._M_ht = &local_58;
      while (local_70._M_cur != (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0) {
        if (((local_70._M_cur)->_M_val).second == 1) {
          ppCVar8 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_60 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          if (ppCVar8 != local_60) {
            uVar4 = ((local_70._M_cur)->_M_val).first;
            do {
              while( true ) {
                pCVar3 = *ppCVar8;
                uVar11 = (ulong)((uint)(pCVar3->m_pPointS->super_CObject).m_Key & 0xffffff00);
                uVar12 = (ulong)((uint)(pCVar3->m_pPointE->super_CObject).m_Key & 0xffffff00);
                if (uVar4 != uVar12 && uVar4 != uVar11) break;
                DelWire(local_78,pCVar3,0);
                CWire::Delete(pCVar3);
                local_88.second = 0;
                local_88.first = uVar11;
                pvVar7 = __gnu_cxx::
                         hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                         ::find_or_insert(&local_58,&local_88);
                pvVar7->second = pvVar7->second + -1;
                local_88.second = 0;
                local_88.first = uVar12;
                pvVar7 = __gnu_cxx::
                         hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                         ::find_or_insert(&local_58,&local_88);
                pvVar7->second = pvVar7->second + -1;
                ppCVar8 = ppCVar8 + 1;
                if ((uVar4 == uVar12 || uVar4 == uVar11) || ppCVar8 == local_60) goto LAB_001197bf;
              }
              ppCVar8 = ppCVar8 + 1;
            } while (ppCVar8 != local_60);
          }
LAB_001197bf:
          if ((long)local_58._M_buckets.
                    super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58._M_buckets.
                    super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0) {
            local_70._M_cur = (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0;
          }
          else {
            lVar9 = (long)local_58._M_buckets.
                          super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58._M_buckets.
                          super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3;
            lVar10 = 0;
            do {
              local_70._M_cur =
                   local_58._M_buckets.
                   super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar10];
              if (local_70._M_cur != (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0)
              goto LAB_00119809;
              lVar10 = lVar10 + 1;
            } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
            local_70._M_cur = (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0;
          }
LAB_00119809:
          local_70._M_ht = &local_58;
          this_00 = local_78;
        }
        else {
          __gnu_cxx::
          _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
          ::operator++(&local_70);
        }
      }
      iVar6 = this_00->m_iMinWL;
      iVar5 = GetLength(this_00,1,1);
      if (iVar6 < iVar5) {
        iVar6 = this_00->m_iMinWL;
      }
      else {
        iVar6 = GetLength(this_00,1,1);
      }
      this_00->m_iMinWL = iVar6;
      if ((this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __assert_fail("m_Wire.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                      ,0x200,"void CNet::Refine()");
      }
      __gnu_cxx::
      hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
      ::~hashtable(&local_58);
    }
  }
  return;
}

Assistant:

void CNet::Refine()
{
	if(IsLocal())	return;
	if(!IsRouted())	return;

	SplitWire();

	hash_map<KEY, int>				RedPoint;
	hash_map<KEY, int>::iterator		itrp;

	vector<CWire*>::iterator itr,end;
	for(itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	{
		CWire*	pWire	=	*itr;

		++RedPoint[pWire->m_pPointS->GetKey()&0xFFFFFF00];
		++RedPoint[pWire->m_pPointE->GetKey()&0xFFFFFF00];
	}

	for(int i=0;i<GetNumPin();++i)
		RedPoint.erase(GetPin(i)->GetKey()&0xFFFFFF00);

	for(itrp=RedPoint.begin();itrp!=RedPoint.end();)
	{
		if(itrp->second==1)	// dangling point [7/5/2006 thyeros]
		{
			KEY	P	=	itrp->first;
	
			for(itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
			{
				CWire*	pWire	=	*itr;

				KEY S	=	pWire->m_pPointS->GetKey()&0xFFFFFF00;
				KEY	E	=	pWire->m_pPointE->GetKey()&0xFFFFFF00;

				if(P==S||P==E)
				{
					DelWire(pWire);
					pWire->Delete();//SAFE_DEL(pWire);

					--RedPoint[S];
					--RedPoint[E];

					break;
				}
			}

			itrp=RedPoint.begin();
		}
		else
		{
			++itrp;
		}
	}

	m_iMinWL	=	MIN(m_iMinWL,GetLength(GET_MODE_STATE,STATE_WIRE_ROUTED));
//	m_iMinVia	=	MIN(m_iMinVia,GetNumVia());

	assert(m_Wire.size());
}